

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ESoinn.cpp
# Opt level: O2

double __thiscall nn::ESoinn::calcAvgDensity(ESoinn *this)

{
  pointer pEVar1;
  ConcreteLogger *this_00;
  ulong uVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  uint32_t uVar6;
  double dVar7;
  undefined1 auVar8 [16];
  string local_50;
  allocator local_29;
  
  this_00 = log_netw;
  std::__cxx11::string::string((string *)&local_50,"calcAvgDensity function",&local_29);
  uVar6 = 0;
  logger::ConcreteLogger::debug(this_00,&local_50,false);
  std::__cxx11::string::~string((string *)&local_50);
  this->m_NumEmptyNeurons = 0;
  pEVar1 = (this->m_Neurons).
           super__Vector_base<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar2 = ((long)(this->m_Neurons).
                 super__Vector_base<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)pEVar1) / 0x88;
  dVar7 = 0.0;
  for (uVar4 = 0; uVar5 = (ulong)uVar4, uVar5 < uVar2; uVar4 = uVar4 + 1) {
    if (pEVar1[uVar5].m_IsDeleted == true) {
      uVar6 = uVar6 + 1;
      this->m_NumEmptyNeurons = uVar6;
    }
    else {
      dVar7 = dVar7 + pEVar1[uVar5].m_Density;
    }
  }
  lVar3 = uVar2 - uVar6;
  auVar8._8_4_ = (int)((ulong)lVar3 >> 0x20);
  auVar8._0_8_ = lVar3;
  auVar8._12_4_ = 0x45300000;
  return dVar7 / ((auVar8._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0));
}

Assistant:

double ESoinn::calcAvgDensity()
    {
        log_netw->debug("calcAvgDensity function");
        m_NumEmptyNeurons = 0;
        double sumLocalSignals = 0;
        for (uint32_t i = 0; i < m_Neurons.size(); i++)
        {
            if (m_Neurons[i].is_deleted())
            {
                m_NumEmptyNeurons++;
                continue;
            }
            sumLocalSignals += m_Neurons[i].density();
        }
        return sumLocalSignals / (double) (m_Neurons.size() - m_NumEmptyNeurons);
    }